

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O0

void __thiscall Fl_Widget::draw_backdrop(Fl_Widget *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Align FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Image *pFVar8;
  Fl_Image *local_18;
  Fl_Image *img;
  Fl_Widget *this_local;
  
  FVar4 = align(this);
  if ((FVar4 & 0x200) != 0) {
    local_18 = image(this);
    if (((local_18 != (Fl_Image *)0x0) && (pFVar8 = deimage(this), pFVar8 != (Fl_Image *)0x0)) &&
       (iVar5 = active_r(this), iVar5 == 0)) {
      local_18 = deimage(this);
    }
    if (local_18 != (Fl_Image *)0x0) {
      iVar5 = this->x_;
      iVar1 = this->w_;
      iVar6 = Fl_Image::w(local_18);
      iVar2 = this->y_;
      iVar3 = this->h_;
      iVar7 = Fl_Image::h(local_18);
      Fl_Image::draw(local_18,iVar5 + (iVar1 - iVar6) / 2,iVar2 + (iVar3 - iVar7) / 2);
    }
  }
  return;
}

Assistant:

void Fl_Widget::draw_backdrop() const {
  if (align() & FL_ALIGN_IMAGE_BACKDROP) {
    const Fl_Image *img = image();
    // if there is no image, we will not draw the deimage either
    if (img && deimage() && !active_r())
      img = deimage();
    if (img)
      ((Fl_Image*)img)->draw(x_+(w_-img->w())/2, y_+(h_-img->h())/2);
  }
}